

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_cdata_node<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags,int indent)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (node->m_type == node_cdata) {
    cVar1 = (char)out.container;
    if (0 < indent && (flags & 1U) == 0) {
      do {
        std::__cxx11::string::push_back(cVar1);
        indent = indent + -1;
      } while (indent != 0);
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    if ((node->super_xml_base<char>).m_value == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (node->super_xml_base<char>).m_value_size;
    }
    if (sVar3 != 0) {
      sVar2 = 0;
      do {
        std::__cxx11::string::push_back(cVar1);
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  __assert_fail("node->type() == node_cdata",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/guirmoreira[P]kuka-cpp/include/rapidxml-1.13/rapidxml_print.hpp"
                ,0xf9,
                "OutIt rapidxml::internal::print_cdata_node(OutIt, const xml_node<Ch> *, int, int) [OutIt = std::back_insert_iterator<std::basic_string<char>>, Ch = char]"
               );
}

Assistant:

inline OutIt print_cdata_node(OutIt out, const xml_node<Ch> *node, int flags, int indent)
        {
            assert(node->type() == node_cdata);
            if (!(flags & print_no_indenting))
                out = fill_chars(out, indent, Ch('\t'));
            *out = Ch('<'); ++out;
            *out = Ch('!'); ++out;
            *out = Ch('['); ++out;
            *out = Ch('C'); ++out;
            *out = Ch('D'); ++out;
            *out = Ch('A'); ++out;
            *out = Ch('T'); ++out;
            *out = Ch('A'); ++out;
            *out = Ch('['); ++out;
            out = copy_chars(node->value(), node->value() + node->value_size(), out);
            *out = Ch(']'); ++out;
            *out = Ch(']'); ++out;
            *out = Ch('>'); ++out;
            return out;
        }